

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

string * GetAutogenTargetName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  string *psVar1;
  cmGeneratorTarget *target_local;
  string *autogenTargetName;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_automoc");
  return __return_storage_ptr__;
}

Assistant:

std::string GetAutogenTargetName(
    cmGeneratorTarget const* target)
{
  std::string autogenTargetName = target->GetName();
  autogenTargetName += "_automoc";
  return autogenTargetName;
}